

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3OpenTableAndIndices
              (Parse *pParse,Table *pTab,int op,u8 p5,int iBase,u8 *aToOpen,int *piDataCur,
              int *piIdxCur)

{
  int iDb_00;
  Vdbe *p;
  int iIdxCur;
  Vdbe *v;
  Index *pIdx;
  int iDataCur;
  int iDb;
  int i;
  u8 *aToOpen_local;
  byte local_25;
  int iBase_local;
  u8 p5_local;
  int op_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if (pTab->nModuleArg == 0) {
    iDb_00 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    p = sqlite3GetVdbe(pParse);
    aToOpen_local._4_4_ = iBase;
    if (iBase < 0) {
      aToOpen_local._4_4_ = pParse->nTab;
    }
    if (piDataCur != (int *)0x0) {
      *piDataCur = aToOpen_local._4_4_;
    }
    if (((pTab->tabFlags & 0x20) == 0) && ((aToOpen == (u8 *)0x0 || (*aToOpen != '\0')))) {
      sqlite3OpenTable(pParse,aToOpen_local._4_4_,iDb_00,pTab,op);
    }
    else {
      sqlite3TableLock(pParse,iDb_00,pTab->tnum,op == 0x6e,pTab->zName);
    }
    if (piIdxCur != (int *)0x0) {
      *piIdxCur = aToOpen_local._4_4_ + 1;
    }
    iDataCur = 0;
    aToOpen_local._4_4_ = aToOpen_local._4_4_ + 1;
    local_25 = p5;
    for (v = (Vdbe *)pTab->pIndex; v != (Vdbe *)0x0; v = *(Vdbe **)&v->nMem) {
      if (((v->nStmtDefImmCons & 0x3000000) == 0x2000000) && ((pTab->tabFlags & 0x20) != 0)) {
        if (piDataCur != (int *)0x0) {
          *piDataCur = aToOpen_local._4_4_;
        }
        local_25 = 0;
      }
      if ((aToOpen == (u8 *)0x0) || (aToOpen[iDataCur + 1] != '\0')) {
        sqlite3VdbeAddOp3(p,op,aToOpen_local._4_4_,(int)v->nStmtDefCons,iDb_00);
        sqlite3VdbeSetP4KeyInfo(pParse,(Index *)v);
        sqlite3VdbeChangeP5(p,(ushort)local_25);
      }
      iDataCur = iDataCur + 1;
      aToOpen_local._4_4_ = aToOpen_local._4_4_ + 1;
    }
    if (pParse->nTab < aToOpen_local._4_4_) {
      pParse->nTab = aToOpen_local._4_4_;
    }
    pParse_local._4_4_ = iDataCur;
  }
  else {
    pParse_local._4_4_ = 0;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3OpenTableAndIndices(
  Parse *pParse,   /* Parsing context */
  Table *pTab,     /* Table to be opened */
  int op,          /* OP_OpenRead or OP_OpenWrite */
  u8 p5,           /* P5 value for OP_Open* opcodes (except on WITHOUT ROWID) */
  int iBase,       /* Use this for the table cursor, if there is one */
  u8 *aToOpen,     /* If not NULL: boolean for each table and index */
  int *piDataCur,  /* Write the database source cursor number here */
  int *piIdxCur    /* Write the first index cursor number here */
){
  int i;
  int iDb;
  int iDataCur;
  Index *pIdx;
  Vdbe *v;

  assert( op==OP_OpenRead || op==OP_OpenWrite );
  assert( op==OP_OpenWrite || p5==0 );
  if( IsVirtual(pTab) ){
    /* This routine is a no-op for virtual tables. Leave the output
    ** variables *piDataCur and *piIdxCur uninitialized so that valgrind
    ** can detect if they are used by mistake in the caller. */
    return 0;
  }
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  if( iBase<0 ) iBase = pParse->nTab;
  iDataCur = iBase++;
  if( piDataCur ) *piDataCur = iDataCur;
  if( HasRowid(pTab) && (aToOpen==0 || aToOpen[0]) ){
    sqlite3OpenTable(pParse, iDataCur, iDb, pTab, op);
  }else{
    sqlite3TableLock(pParse, iDb, pTab->tnum, op==OP_OpenWrite, pTab->zName);
  }
  if( piIdxCur ) *piIdxCur = iBase;
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    int iIdxCur = iBase++;
    assert( pIdx->pSchema==pTab->pSchema );
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      if( piDataCur ) *piDataCur = iIdxCur;
      p5 = 0;
    }
    if( aToOpen==0 || aToOpen[i+1] ){
      sqlite3VdbeAddOp3(v, op, iIdxCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      sqlite3VdbeChangeP5(v, p5);
      VdbeComment((v, "%s", pIdx->zName));
    }
  }
  if( iBase>pParse->nTab ) pParse->nTab = iBase;
  return i;
}